

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraditionalHammerer.cpp
# Opt level: O2

void TraditionalHammerer::hammer_sync
               (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *aggressors,int acts,
               char *d1,char *d2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t j;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppcVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = (long)(aggressors->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(aggressors->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)acts;
  lVar4 = SUB168(auVar3 / auVar1,0);
  uVar5 = (ulong)(long)acts % uVar5;
  uVar8 = CONCAT71(SUB167(auVar3 / auVar1,1),*d2);
  do {
    clflushopt(*d1);
    clflushopt(*d2);
    rdtscp();
    uVar9 = uVar5 << 0x20 | uVar8;
    uVar8 = CONCAT71((int7)(uVar8 >> 8),*d2);
    rdtscp();
    uVar5 = (uVar5 << 0x20 | uVar8) - uVar9;
  } while (uVar5 < 0x3e9);
  uVar5 = lVar4 + (ulong)(lVar4 == 0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  auVar1 = ZEXT816(0) << 0x40 | ZEXT816(1000000);
  ppcVar7 = SUB168(auVar1 % auVar2,0);
  for (uVar8 = 0; uVar8 < SUB168(auVar1 / auVar2,0); uVar8 = uVar8 + 1) {
    for (uVar9 = 0; uVar9 < uVar5; uVar9 = uVar9 + 1) {
      for (uVar6 = 0;
          ppcVar7 = (aggressors->
                    super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>)._M_impl.
                    super__Vector_impl_data._M_start,
          uVar6 < ((long)(aggressors->
                         super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar7 >> 3) - 2U;
          uVar6 = uVar6 + 1) {
        clflushopt(*ppcVar7[uVar6]);
      }
    }
    do {
      rdtscp();
      uVar6 = (long)ppcVar7 << 0x20 | uVar9;
      clflushopt(*d1);
      clflushopt(*d2);
      uVar9 = CONCAT71((int7)(uVar9 >> 8),*d2);
      rdtscp();
      ppcVar7 = (pointer)(((long)ppcVar7 << 0x20 | uVar9) - uVar6);
    } while (ppcVar7 < (pointer)0x3e9);
  }
  return;
}

Assistant:

void TraditionalHammerer::hammer_sync(std::vector<volatile char *> &aggressors, int acts,
                                      volatile char *d1, volatile char *d2) {
  size_t ref_rounds = std::max(1UL, acts/aggressors.size());

  // determines how often we are repeating
  size_t agg_rounds = ref_rounds;
  uint64_t before, after;

  (void)*d1;
  (void)*d2;

  // synchronize with the beginning of an interval
  while (true) {
    clflushopt(d1);
    clflushopt(d2);
    mfence();
    before = rdtscp();
    lfence();
    (void)*d1;
    (void)*d2;
    after = rdtscp();
    // check if an ACTIVATE was issued
    if ((after - before) > 1000) {
      break;
    }
  }

  // perform hammering for HAMMER_ROUNDS/ref_rounds times
  for (size_t i = 0; i < HAMMER_ROUNDS/ref_rounds; i++) {
    for (size_t j = 0; j < agg_rounds; j++) {
      for (size_t k = 0; k < aggressors.size() - 2; k++) {
        (void)(*aggressors[k]);
        clflushopt(aggressors[k]);
      }
      mfence();
    }

    // after HAMMER_ROUNDS/ref_rounds times hammering, check for next ACTIVATE
    while (true) {
      mfence();
      lfence();
      before = rdtscp();
      lfence();
      clflushopt(d1);
      (void)*d1;
      clflushopt(d2);
      (void)*d2;
      after = rdtscp();
      lfence();
      // stop if an ACTIVATE was issued
      if ((after - before) > 1000) break;
    }
  }
}